

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

int sat_solver2_solve(sat_solver2 *s,lit *begin,lit *end,ABC_INT64_T nConfLimit,
                     ABC_INT64_T nInsLimit,ABC_INT64_T nConfLimitGlobal,ABC_INT64_T nInsLimitGlobal)

{
  int iVar1;
  lit lVar2;
  lit e;
  int iVar3;
  clause *pcVar4;
  abctime aVar5;
  double dVar6;
  double local_e0;
  clause *confl_1;
  clause *confl;
  clause *r;
  lit *plStack_60;
  lit p;
  lit *i;
  int proof_id;
  lbool status;
  ABC_INT64_T nof_conflicts;
  int restart_iter;
  ABC_INT64_T nConfLimitGlobal_local;
  ABC_INT64_T nInsLimit_local;
  ABC_INT64_T nConfLimit_local;
  lit *end_local;
  lit *begin_local;
  sat_solver2 *s_local;
  
  nof_conflicts._4_4_ = 0;
  i._7_1_ = '\0';
  s->hLearntLast = -1;
  s->hProofLast = -1;
  s->nConfLimit = 0;
  s->nInsLimit = 0;
  if (nConfLimit != 0) {
    s->nConfLimit = (s->stats).conflicts + nConfLimit;
  }
  if (nInsLimit != 0) {
    s->nInsLimit = (s->stats).propagations + nInsLimit;
  }
  if ((nConfLimitGlobal != 0) && ((s->nConfLimit == 0 || (nConfLimitGlobal < s->nConfLimit)))) {
    s->nConfLimit = nConfLimitGlobal;
  }
  if ((nInsLimitGlobal != 0) && ((s->nInsLimit == 0 || (nInsLimitGlobal < s->nInsLimit)))) {
    s->nInsLimit = nInsLimitGlobal;
  }
  s->root_level = (int)((long)end - (long)begin >> 2);
  for (plStack_60 = begin; plStack_60 < end; plStack_60 = plStack_60 + 1) {
    lVar2 = *plStack_60;
    iVar1 = lit_var(lVar2);
    if (s->size <= iVar1) {
      __assert_fail("lit_var(p) < s->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                    ,0x76a,
                    "int sat_solver2_solve(sat_solver2 *, lit *, lit *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T)"
                   );
    }
    veci_push(&s->trail_lim,s->qtail);
    iVar1 = solver2_enqueue(s,lVar2,0);
    if (iVar1 == 0) {
      iVar1 = lit_reason(s,lVar2);
      pcVar4 = clause2_read(s,iVar1);
      if (pcVar4 == (clause *)0x0) {
        i._0_4_ = -1;
        veci_resize(&s->conf_final,0);
        e = lit_neg(lVar2);
        veci_push(&s->conf_final,e);
        iVar1 = lit_var(lVar2);
        iVar1 = var_level(s,iVar1);
        if (0 < iVar1) {
          veci_push(&s->conf_final,lVar2);
        }
      }
      else {
        i._0_4_ = solver2_analyze_final(s,pcVar4,1);
        lVar2 = lit_neg(lVar2);
        veci_push(&s->conf_final,lVar2);
      }
      s->hProofLast = (int)i;
      solver2_canceluntil(s,0);
      return -1;
    }
    pcVar4 = solver2_propagate(s);
    if (pcVar4 != (clause *)0x0) {
      iVar1 = solver2_analyze_final(s,pcVar4,0);
      if (0 < (s->conf_final).size) {
        s->hProofLast = iVar1;
        solver2_canceluntil(s,0);
        return -1;
      }
      __assert_fail("s->conf_final.size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                    ,0x78b,
                    "int sat_solver2_solve(sat_solver2 *, lit *, lit *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T)"
                   );
    }
  }
  iVar1 = s->root_level;
  iVar3 = solver2_dlevel(s);
  if (iVar1 != iVar3) {
    __assert_fail("s->root_level == solver2_dlevel(s)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x792,
                  "int sat_solver2_solve(sat_solver2 *, lit *, lit *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T)"
                 );
  }
  if (0 < s->verbosity) {
    Abc_Print(1,"==================================[MINISAT]===================================\n");
    Abc_Print(1,"| Conflicts |     ORIGINAL     |              LEARNT              | Progress |\n");
    Abc_Print(1,"|           | Clauses Literals |   Limit Clauses Literals  Lit/Cl |          |\n");
    Abc_Print(1,"==============================================================================\n");
  }
  while (i._7_1_ == '\0') {
    if (0 < s->verbosity) {
      if ((s->stats).learnts == 0) {
        local_e0 = 0.0;
      }
      else {
        local_e0 = (double)(s->stats).learnts_literals / (double)(s->stats).learnts;
      }
      Abc_Print(1,"| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n",
                (double)(s->stats).conflicts,(double)(s->stats).clauses,
                (double)(s->stats).clauses_literals,(double)s->nLearntMax,(double)(s->stats).learnts
                ,(double)(s->stats).learnts_literals,local_e0,s->progress_estimate * 100.0);
      fflush(_stdout);
    }
    if ((s->nRuntimeLimit != 0) && (aVar5 = Abc_Clock(), s->nRuntimeLimit < aVar5)) break;
    if ((s->nLearntMax != 0) &&
       ((iVar1 = veci_size(&s->act_clas), s->nLearntMax <= iVar1 && (s->pPrf2 == (Prf_Man_t *)0x0)))
       ) {
      sat_solver2_reducedb(s);
    }
    iVar1 = nof_conflicts._4_4_ + 1;
    dVar6 = luby2(2.0,nof_conflicts._4_4_);
    i._7_1_ = solver2_search(s,(long)(dVar6 * 100.0));
    if (((s->nConfLimit != 0) && (s->nConfLimit < (s->stats).conflicts)) ||
       ((nof_conflicts._4_4_ = iVar1, s->nInsLimit != 0 && (s->nInsLimit < (s->stats).propagations))
       )) break;
  }
  if (0 < s->verbosity) {
    Abc_Print(1,"==============================================================================\n");
  }
  solver2_canceluntil(s,0);
  return (int)i._7_1_;
}

Assistant:

int sat_solver2_solve(sat_solver2* s, lit* begin, lit* end, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, ABC_INT64_T nConfLimitGlobal, ABC_INT64_T nInsLimitGlobal)
{
    int restart_iter = 0;
    ABC_INT64_T  nof_conflicts;
    lbool status = l_Undef;
    int proof_id;
    lit * i;

    s->hLearntLast = -1;
    s->hProofLast = -1;

    // set the external limits
//    s->nCalls++;
//    s->nRestarts  = 0;
    s->nConfLimit = 0;
    s->nInsLimit  = 0;
    if ( nConfLimit )
        s->nConfLimit = s->stats.conflicts + nConfLimit;
    if ( nInsLimit )
//        s->nInsLimit = s->stats.inspects + nInsLimit;
        s->nInsLimit = s->stats.propagations + nInsLimit;
    if ( nConfLimitGlobal && (s->nConfLimit == 0 || s->nConfLimit > nConfLimitGlobal) )
        s->nConfLimit = nConfLimitGlobal;
    if ( nInsLimitGlobal && (s->nInsLimit == 0 || s->nInsLimit > nInsLimitGlobal) )
        s->nInsLimit = nInsLimitGlobal;

/*
    // Perform assumptions:
    root_level = assumps.size();
    for (int i = 0; i < assumps.size(); i++){
        Lit p = assumps[i];
        assert(var(p) < nVars());
        if (!solver2_assume(p)){
            GClause r = reason[var(p)];
            if (r != Gclause2_NULL){
                clause* confl;
                if (r.isLit()){
                    confl = propagate_tmpbin;
                    (*confl)[1] = ~p;
                    (*confl)[0] = r.lit();
                }else
                    confl = r.clause();
                analyzeFinal(confl, true);
                conflict.push(~p);
            }else
                conflict.clear(),
                conflict.push(~p);
            cancelUntil(0);
            return false; }
        clause* confl = propagate();
        if (confl != NULL){
            analyzeFinal(confl), assert(conflict.size() > 0);
            cancelUntil(0);
            return false; }
    }
    assert(root_level == decisionLevel());
*/

    // Perform assumptions:
    s->root_level = end - begin;
    for ( i = begin; i < end; i++ )
    {
        lit p = *i;
        assert(lit_var(p) < s->size);
        veci_push(&s->trail_lim,s->qtail);
        if (!solver2_enqueue(s,p,0))
        {
            clause* r = clause2_read(s, lit_reason(s,p));
            if (r != NULL)
            {
                clause* confl = r;
                proof_id = solver2_analyze_final(s, confl, 1);
                veci_push(&s->conf_final, lit_neg(p));
            }
            else
            {
//                assert( 0 );
//                r = var_unit_clause( s, lit_var(p) );
//                assert( r != NULL );
//                proof_id = clause2_proofid(s, r, 0);
                proof_id = -1; // the only case when ProofId is not assigned (conflicting assumptions)
                veci_resize(&s->conf_final,0);
                veci_push(&s->conf_final, lit_neg(p));
                // the two lines below are a bug fix by Siert Wieringa 
                if (var_level(s, lit_var(p)) > 0)
                    veci_push(&s->conf_final, p);
            }
            s->hProofLast = proof_id;
            solver2_canceluntil(s, 0);
            return l_False;
        }
        else
        {
            clause* confl = solver2_propagate(s);
            if (confl != NULL){
                proof_id = solver2_analyze_final(s, confl, 0);
                assert(s->conf_final.size > 0);
                s->hProofLast = proof_id;
                solver2_canceluntil(s, 0);
                return l_False;
            }
        }
    }
    assert(s->root_level == solver2_dlevel(s));

    if (s->verbosity >= 1){
        Abc_Print(1,"==================================[MINISAT]===================================\n");
        Abc_Print(1,"| Conflicts |     ORIGINAL     |              LEARNT              | Progress |\n");
        Abc_Print(1,"|           | Clauses Literals |   Limit Clauses Literals  Lit/Cl |          |\n");
        Abc_Print(1,"==============================================================================\n");
    }

    while (status == l_Undef){
        if (s->verbosity >= 1)
        {
            Abc_Print(1,"| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n",
                (double)s->stats.conflicts,
                (double)s->stats.clauses,
                (double)s->stats.clauses_literals,
                (double)s->nLearntMax,
                (double)s->stats.learnts,
                (double)s->stats.learnts_literals,
                (s->stats.learnts == 0)? 0.0 : (double)s->stats.learnts_literals / s->stats.learnts,
                s->progress_estimate*100);
            fflush(stdout);
        }
        if ( s->nRuntimeLimit && Abc_Clock() > s->nRuntimeLimit )
            break;
        // reduce the set of learnt clauses
        if ( s->nLearntMax && veci_size(&s->act_clas) >= s->nLearntMax && s->pPrf2 == NULL )
            sat_solver2_reducedb(s);
        // perform next run
        nof_conflicts = (ABC_INT64_T)( 100 * luby2(2, restart_iter++) );
        status = solver2_search(s, nof_conflicts);
        // quit the loop if reached an external limit
        if ( s->nConfLimit && s->stats.conflicts > s->nConfLimit )
            break;
        if ( s->nInsLimit  && s->stats.propagations > s->nInsLimit )
            break;
    }
    if (s->verbosity >= 1)
        Abc_Print(1,"==============================================================================\n");

    solver2_canceluntil(s,0);
//    assert( s->qhead == s->qtail );
//    if ( status == l_True )
//        sat_solver2_verify( s );
    return status;
}